

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O3

void UI::gather_slice_arg(int *argc,char **argv)

{
  int iVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  string local_128;
  allocator<char> local_108;
  allocator<char> local_107;
  allocator<char> local_106;
  allocator<char> local_105;
  int local_104;
  string local_100;
  string local_e0;
  long local_c0;
  long local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,argv[4],&local_105);
  bVar3 = isinteger(&local_128);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,argv[5],&local_106);
    bVar3 = isinteger(&local_100);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,argv[6],&local_107);
      bVar3 = isinteger(&local_e0);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[7],&local_108);
        bVar3 = isinteger(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == false) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Invalid co-ordinates detected. Aborting.","");
    print_ln(&local_b0);
    local_70._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
LAB_0010be60:
    operator_delete(local_70._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,argv[4],(allocator<char> *)&local_e0);
  _Var2._M_p = local_128._M_dataplus._M_p;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(_Var2._M_p,(char **)&local_100,10);
  if (local_100._M_dataplus._M_p == _Var2._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_0010be86:
    std::__throw_out_of_range("stoi");
LAB_0010be92:
    std::__throw_invalid_argument("stoi");
LAB_0010be9e:
    std::__throw_out_of_range("stoi");
LAB_0010beaa:
    std::__throw_invalid_argument("stoi");
LAB_0010beb6:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_0010be86;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_b8 = lVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,argv[5],(allocator<char> *)&local_e0);
    _Var2._M_p = local_128._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(local_128._M_dataplus._M_p,(char **)&local_100,10);
    if (local_100._M_dataplus._M_p == _Var2._M_p) goto LAB_0010be92;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010be9e;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_c0 = lVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,argv[6],(allocator<char> *)&local_e0);
    _Var2._M_p = local_128._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(local_128._M_dataplus._M_p,(char **)&local_100,10);
    if (local_100._M_dataplus._M_p == _Var2._M_p) goto LAB_0010beaa;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010beb6;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,argv[7],(allocator<char> *)&local_e0);
    _Var2._M_p = local_128._M_dataplus._M_p;
    local_104 = *piVar4;
    *piVar4 = 0;
    lVar6 = strtol(local_128._M_dataplus._M_p,(char **)&local_100,10);
    if (local_100._M_dataplus._M_p != _Var2._M_p) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = local_104;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,argv[2],(allocator<char> *)&local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,argv[3],(allocator<char> *)&local_100);
        execute_slice(&local_70,&local_90,(int)local_b8,(int)local_c0,(int)lVar5,(int)lVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_b0.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return;
        }
        goto LAB_0010be60;
      }
      goto LAB_0010bece;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010bece:
  uVar7 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

void UI::gather_slice_arg(int &argc, char *argv[])
{
    if( (isinteger(argv[4]))
     && (isinteger(argv[5]))
     && (isinteger(argv[6]))
     && (isinteger(argv[7])) )
    {
        int x1 = std::stoi(argv[4]);
        int y1 = std::stoi(argv[5]);
        int x2 = std::stoi(argv[6]);
        int y2 = std::stoi(argv[7]);
        execute_slice(argv[2],argv[3],x1,y1,x2,y2);
    }
    else
    {
        print_ln("Invalid co-ordinates detected. Aborting.");
    }
}